

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O1

int32_t __thiscall
icu_63::TimeZoneFormat::parseOffsetISO8601
          (TimeZoneFormat *this,UnicodeString *text,ParsePosition *pos,UBool extendedOnly,
          UBool *hasDigitOffset)

{
  short sVar1;
  uint uVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  char16_t *pcVar6;
  char16_t cVar7;
  uint uVar8;
  ParsePosition posOffset;
  ParsePosition posBasic;
  int local_58;
  ParsePosition local_50;
  ParsePosition local_40;
  
  if (hasDigitOffset != (UBool *)0x0) {
    *hasDigitOffset = '\0';
  }
  uVar2 = pos->index;
  sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar8 = (text->fUnion).fFields.fLength;
  }
  else {
    uVar8 = (int)sVar1 >> 5;
  }
  if ((int)uVar8 <= (int)uVar2) {
LAB_001ff6c2:
    pos->errorIndex = uVar2;
    return 0;
  }
  cVar7 = L'\xffff';
  if (uVar2 < uVar8) {
    if (((int)sVar1 & 2U) == 0) {
      pcVar6 = (text->fUnion).fFields.fArray;
    }
    else {
      pcVar6 = (char16_t *)((long)&text->fUnion + 2);
    }
    cVar7 = pcVar6[(int)uVar2];
  }
  if ((cVar7 & 0xffdfU) == 0x5a) {
    pos->index = uVar2 + 1;
    return 0;
  }
  if (cVar7 == L'+') {
    local_58 = 1;
  }
  else {
    if (cVar7 != L'-') goto LAB_001ff6c2;
    local_58 = -1;
  }
  local_50.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003dcfb8;
  local_50.errorIndex = -1;
  local_50.index = uVar2 + 1;
  iVar4 = parseAsciiOffsetFields(text,&local_50,L':',FIELDS_H,FIELDS_HMS);
  iVar3 = local_50.index;
  if (((extendedOnly == '\0') && (local_50.errorIndex == -1)) && ((int)(local_50.index - uVar2) < 4)
     ) {
    local_40.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003dcfb8;
    local_40.errorIndex = -1;
    local_40.index = uVar2 + 1;
    iVar5 = parseAbuttingAsciiOffsetFields(text,&local_40,FIELDS_H,FIELDS_HMS,'\0');
    if ((local_40.errorIndex == -1) && (iVar3 < local_40.index)) {
      local_50.index = local_40.index;
      iVar4 = iVar5;
    }
    ParsePosition::~ParsePosition(&local_40);
  }
  if (local_50.errorIndex == -1) {
    pos->index = local_50.index;
    if (hasDigitOffset != (UBool *)0x0) {
      *hasDigitOffset = '\x01';
    }
    iVar4 = iVar4 * local_58;
  }
  else {
    pos->errorIndex = uVar2;
    iVar4 = 0;
  }
  ParsePosition::~ParsePosition(&local_50);
  return iVar4;
}

Assistant:

int32_t
TimeZoneFormat::parseOffsetISO8601(const UnicodeString& text, ParsePosition& pos, UBool extendedOnly, UBool* hasDigitOffset /* = NULL */) const {
    if (hasDigitOffset) {
        *hasDigitOffset = FALSE;
    }
    int32_t start = pos.getIndex();
    if (start >= text.length()) {
        pos.setErrorIndex(start);
        return 0;
    }

    UChar firstChar = text.charAt(start);
    if (firstChar == ISO8601_UTC || firstChar == (UChar)(ISO8601_UTC + 0x20)) {
        // "Z" (or "z") - indicates UTC
        pos.setIndex(start + 1);
        return 0;
    }

    int32_t sign = 1;
    if (firstChar == PLUS) {
        sign = 1;
    } else if (firstChar == MINUS) {
        sign = -1;
    } else {
        // Not an ISO 8601 offset string
        pos.setErrorIndex(start);
        return 0;
    }
    ParsePosition posOffset(start + 1);
    int32_t offset = parseAsciiOffsetFields(text, posOffset, ISO8601_SEP, FIELDS_H, FIELDS_HMS);
    if (posOffset.getErrorIndex() == -1 && !extendedOnly && (posOffset.getIndex() - start <= 3)) {
        // If the text is successfully parsed as extended format with the options above, it can be also parsed
        // as basic format. For example, "0230" can be parsed as offset 2:00 (only first digits are valid for
        // extended format), but it can be parsed as offset 2:30 with basic format. We use longer result.
        ParsePosition posBasic(start + 1);
        int32_t tmpOffset = parseAbuttingAsciiOffsetFields(text, posBasic, FIELDS_H, FIELDS_HMS, FALSE);
        if (posBasic.getErrorIndex() == -1 && posBasic.getIndex() > posOffset.getIndex()) {
            offset = tmpOffset;
            posOffset.setIndex(posBasic.getIndex());
        }
    }

    if (posOffset.getErrorIndex() != -1) {
        pos.setErrorIndex(start);
        return 0;
    }

    pos.setIndex(posOffset.getIndex());
    if (hasDigitOffset) {
        *hasDigitOffset = TRUE;
    }
    return sign * offset;
}